

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double units::generateLeadingNumber(string *ustring,size_t *index)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  const_reference pvVar5;
  ulong *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  double __value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  size_t *unaff_retaddr;
  string *in_stack_00000008;
  double res_1;
  size_t oindex_1;
  double res;
  size_t oindex;
  double val;
  string *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  double in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  double local_20;
  double local_8;
  
  *in_RSI = 0;
  local_20 = getNumberBlock(in_stack_00000008,unaff_retaddr);
  uVar2 = std::isnan(local_20);
  if ((uVar2 & 1) == 0) {
    while( true ) {
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*in_RSI;
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::size(in_RDI);
      if (pbVar4 <= pbVar6) break;
      pvVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
      iVar3 = (int)*pvVar5;
      if (iVar3 == 0x28) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (pbVar6,CONCAT44(0x28,in_stack_ffffffffffffff70),
                   (size_type)in_stack_ffffffffffffff68);
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 getNumberBlock(in_stack_00000008,unaff_retaddr);
        std::__cxx11::string::~string(pbVar6);
        in_stack_ffffffffffffff60 = pbVar6;
        uVar2 = std::isnan((double)pbVar6);
        if ((uVar2 & 1) != 0) {
          return local_20;
        }
        local_20 = (double)pbVar6 * local_20;
        *in_RSI = *in_RSI + 1;
      }
      else {
        if (iVar3 != 0x2a) {
          if ((iVar3 == 0x2b) || (iVar3 - 0x2dU < 2)) {
            *in_RSI = 0;
            return NAN;
          }
          if ((iVar3 != 0x2f) && (iVar3 != 0x78)) {
            return local_20;
          }
        }
        bVar1 = looksLikeNumber(in_stack_ffffffffffffff58,0x780a6b);
        if ((!bVar1) &&
           (pvVar5 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               (in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58),
           *pvVar5 != '(')) {
          return local_20;
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (pbVar6,CONCAT44(iVar3,in_stack_ffffffffffffff70),
                   (size_type)in_stack_ffffffffffffff68);
        __value = getNumberBlock(in_stack_00000008,unaff_retaddr);
        std::__cxx11::string::~string(in_stack_ffffffffffffff60);
        in_stack_ffffffffffffff68 = __value;
        uVar2 = std::isnan(__value);
        if ((uVar2 & 1) != 0) {
          return local_20;
        }
        pvVar5 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
        if (*pvVar5 == '/') {
          local_20 = local_20 / __value;
        }
        else {
          local_20 = __value * local_20;
        }
        *in_RSI = *in_RSI + 1;
      }
    }
    local_8 = local_20;
  }
  else {
    *in_RSI = 0;
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

double generateLeadingNumber(const std::string& ustring, size_t& index) noexcept
{
    index = 0;
    double val = getNumberBlock(ustring, index);
    if (std::isnan(val)) {
        index = 0;
        return val;
    }
    while (true) {
        if (index >= ustring.size()) {
            return val;
        }
        switch (ustring[index]) {
            case '.':
            case '-':
            case '+':
                index = 0;
                return constants::invalid_conversion;
            case '/':
            case '*':
            case 'x':
                if (looksLikeNumber(ustring, index + 1) ||
                    ustring[index + 1] == '(') {
                    size_t oindex{0};
                    double res =
                        getNumberBlock(ustring.substr(index + 1), oindex);
                    if (!std::isnan(res)) {
                        if (ustring[index] == '/') {
                            val /= res;
                        } else {
                            val *= res;
                        }

                        index = oindex + index + 1;
                    } else {
                        return val;
                    }
                } else {
                    return val;
                }
                break;
            case '(': {
                size_t oindex{0};
                double res = getNumberBlock(ustring.substr(index), oindex);
                if (!std::isnan(res)) {
                    val *= res;
                    index = oindex + index + 1;
                } else {
                    return val;
                }
                break;
            }
            default:
                return val;
        }
    }
}